

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

int32_t __thiscall fasttext::Dictionary::getId(Dictionary *this,string_view w)

{
  int32_t iVar1;
  size_t sVar2;
  uint32_t h;
  
  h = 0x811c9dc5;
  if (w._M_len != 0) {
    sVar2 = 0;
    do {
      h = ((int)w._M_str[sVar2] ^ h) * 0x1000193;
      sVar2 = sVar2 + 1;
    } while (w._M_len != sVar2);
  }
  iVar1 = find(this,w,h);
  return (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[iVar1];
}

Assistant:

int32_t Dictionary::getId(const std::string_view w) const {
  int32_t h = find(w);
  return word2int_[h];
}